

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

void Js::JavascriptOperators::OP_SetHomeObj(Var method,Var homeObj)

{
  ScriptContext *this;
  ThreadContext *threadContext;
  undefined1 local_40 [8];
  JsReentLock reentrancylock;
  ScriptFunctionBase *scriptFunction;
  Var homeObj_local;
  Var method_local;
  
  reentrancylock._24_8_ = VarTo<Js::ScriptFunctionBase>(method);
  this = RecyclableObject::GetScriptContext((RecyclableObject *)reentrancylock._24_8_);
  threadContext = ScriptContext::GetThreadContext(this);
  JsReentLock::JsReentLock((JsReentLock *)local_40,threadContext);
  (**(code **)(*(long *)reentrancylock._24_8_ + 0x3a0))(reentrancylock._24_8_,homeObj);
  JsReentLock::~JsReentLock((JsReentLock *)local_40);
  return;
}

Assistant:

void JavascriptOperators::OP_SetHomeObj(Var method, Var homeObj)
    {
        ScriptFunctionBase *scriptFunction = VarTo<ScriptFunctionBase>(method);
        JIT_HELPER_NOT_REENTRANT_HEADER(SetHomeObj, reentrancylock, scriptFunction->GetScriptContext()->GetThreadContext());
        scriptFunction->SetHomeObj(homeObj);
        JIT_HELPER_END(SetHomeObj);
    }